

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_ar.c
# Opt level: O0

int ar_parse_gnu_filename_table(archive_read *a)

{
  long lVar1;
  long lVar2;
  char *pcVar3;
  archive *in_RDI;
  size_t size;
  char *p;
  ar *ar;
  char *local_20;
  int local_4;
  
  lVar1 = *(long *)in_RDI[0x15].archive_format_name;
  lVar2 = *(long *)(lVar1 + 0x28);
  for (local_20 = *(char **)(lVar1 + 0x20);
      local_20 < (char *)(*(long *)(lVar1 + 0x20) + lVar2 + -1); local_20 = local_20 + 1) {
    if (*local_20 == '/') {
      pcVar3 = local_20 + 1;
      *local_20 = '\0';
      if (*pcVar3 != '\n') goto LAB_0014016f;
      *pcVar3 = '\0';
      local_20 = pcVar3;
    }
  }
  if (((local_20 == (char *)(*(long *)(lVar1 + 0x20) + lVar2)) || (*local_20 == '\n')) ||
     (*local_20 == '`')) {
    *(undefined1 *)(*(long *)(lVar1 + 0x20) + lVar2 + -1) = 0;
    local_4 = 0;
  }
  else {
LAB_0014016f:
    archive_set_error(in_RDI,0x16,"Invalid string table");
    free(*(void **)(lVar1 + 0x20));
    *(undefined8 *)(lVar1 + 0x20) = 0;
    local_4 = -0x14;
  }
  return local_4;
}

Assistant:

static int
ar_parse_gnu_filename_table(struct archive_read *a)
{
	struct ar *ar;
	char *p;
	size_t size;

	ar = (struct ar*)(a->format->data);
	size = ar->strtab_size;

	for (p = ar->strtab; p < ar->strtab + size - 1; ++p) {
		if (*p == '/') {
			*p++ = '\0';
			if (*p != '\n')
				goto bad_string_table;
			*p = '\0';
		}
	}
	/*
	 * GNU ar always pads the table to an even size.
	 * The pad character is either '\n' or '`'.
	 */
	if (p != ar->strtab + size && *p != '\n' && *p != '`')
		goto bad_string_table;

	/* Enforce zero termination. */
	ar->strtab[size - 1] = '\0';

	return (ARCHIVE_OK);

bad_string_table:
	archive_set_error(&a->archive, EINVAL,
	    "Invalid string table");
	free(ar->strtab);
	ar->strtab = NULL;
	return (ARCHIVE_WARN);
}